

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionInfo * __thiscall Js::FunctionBody::GetStackNestedFuncParentStrongRef(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  RecyclerWeakReference<Js::FunctionInfo> *pRVar3;
  undefined4 *puVar4;
  
  pRVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)5,Memory::RecyclerWeakReference<Js::FunctionInfo>*>
                     ((FunctionProxy *)this);
  if (pRVar3 == (RecyclerWeakReference<Js::FunctionInfo> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1062,"(this->GetStackNestedFuncParent() != nullptr)",
                                "this->GetStackNestedFuncParent() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pRVar3 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)5,Memory::RecyclerWeakReference<Js::FunctionInfo>*>
                     ((FunctionProxy *)this);
  return (FunctionInfo *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef;
}

Assistant:

FunctionInfo * FunctionBody::GetStackNestedFuncParentStrongRef()
    {
        Assert(this->GetStackNestedFuncParent() != nullptr);
        return this->GetStackNestedFuncParent()->Get();
    }